

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spreadsketch.cpp
# Opt level: O0

void __thiscall DetectorSS::Intersec(DetectorSS *this,uchar *dst,uchar *src,int start,int len)

{
  char cVar1;
  sbyte sVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  int pos2;
  int pos;
  int index;
  int n;
  uchar temp;
  int curlen;
  int len_local;
  int start_local;
  uchar *src_local;
  uchar *dst_local;
  DetectorSS *this_local;
  
  for (curlen = 0; curlen < len; curlen = (8 - uVar5) + curlen) {
    iVar3 = start + curlen >> 3;
    uVar4 = start + curlen & 7;
    uVar5 = curlen & 7;
    sVar2 = (sbyte)uVar4;
    iVar6 = curlen >> 3;
    cVar1 = (char)uVar5;
    if ((int)(8 - uVar4) < (int)(8 - uVar5)) {
      dst[iVar6] = dst[iVar6] &
                   ((src[iVar3] & (byte)(0xff >> sVar2)) << (sVar2 - cVar1 & 0x1fU) |
                   (char)(1 << (sVar2 - cVar1 & 0x1fU)) - 1U);
      uVar5 = uVar4;
    }
    else {
      dst[iVar6] = dst[iVar6] &
                   ((byte)((int)(uint)(src[iVar3] & (byte)(0xff >> sVar2)) >>
                          (cVar1 - sVar2 & 0x1fU)) | -(char)(1 << (8U - cVar1 & 0x1f)));
    }
  }
  return;
}

Assistant:

void DetectorSS::Intersec(unsigned char* dst, unsigned char* src, int start, int len) {
	int curlen = 0;
	while (curlen < len) {
		unsigned char temp = 255;
		int n = start + curlen;
		int index = n >> 3;
		int pos = n & 0x07;
		int pos2 = curlen & 0x07;
		if ((8 - pos2) > (8 - pos)) {
			temp &= src[index] & (0xff >> pos);
			temp <<= (pos - pos2);
			temp |= ((1 << (pos - pos2)) - 1);
			dst[curlen >> 3] &= temp;
			curlen += 8 - pos;
		}
		else {
			temp &= src[index] & (0xff >> pos);
			temp >>= (pos2 - pos);
			temp |= 256 - (1 << (8 - pos2));
			dst[curlen >> 3] &= temp;
			curlen += 8 - pos2;
		}
	}
}